

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O3

lzma_ret lzma_index_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_index *i)

{
  lzma_ret lVar1;
  undefined4 *puVar2;
  
  if ((code *)next->init != lzma_index_encoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)lzma_index_encoder_init;
  if (i == (lzma_index *)0x0) {
    lVar1 = LZMA_PROG_ERROR;
  }
  else {
    puVar2 = (undefined4 *)next->coder;
    if (puVar2 == (undefined4 *)0x0) {
      puVar2 = (undefined4 *)lzma_alloc(0x150,allocator);
      next->coder = puVar2;
      if (puVar2 == (undefined4 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = index_encode;
      next->end = index_encoder_end;
    }
    lzma_index_iter_init((lzma_index_iter *)(puVar2 + 4),i);
    lVar1 = LZMA_OK;
    *puVar2 = 0;
    *(lzma_index **)(puVar2 + 2) = i;
    *(undefined8 *)(puVar2 + 0x50) = 0;
    puVar2[0x52] = 0;
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_index_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_index *i)
{
	lzma_next_coder_init(&lzma_index_encoder_init, next, allocator);

	if (i == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_index_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &index_encode;
		next->end = &index_encoder_end;
	}

	index_encoder_reset(next->coder, i);

	return LZMA_OK;
}